

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTricycle.cpp
# Opt level: O2

int __thiscall CTestTricycle::Run(CTestTricycle *this,int nTestCase)

{
  float time;
  float steering_angle;
  int iVar1;
  ostream *poVar2;
  CTricycle *pCVar3;
  CVirtualGyro *pCVar4;
  pointer p_Var5;
  SPose pose;
  
  SetFilename(this,nTestCase);
  iVar1 = ReadInputFile(this);
  if (iVar1 == 0) {
    CreateResultFiles(this);
    pCVar3 = TSingleton<CTricycle>::GetInstance();
    Write(this,0.0,pCVar3->m_pose);
    for (p_Var5 = (this->m_vRecord).
                  super__Vector_base<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var5 != (this->m_vRecord).
                  super__Vector_base<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
      pCVar4 = TSingleton<CVirtualGyro>::GetInstance();
      CVirtualGyro::Update(pCVar4,p_Var5->time,p_Var5->steering_angle,p_Var5->encoder_ticks);
      time = p_Var5->time;
      steering_angle = p_Var5->steering_angle;
      iVar1 = p_Var5->encoder_ticks;
      pCVar4 = TSingleton<CVirtualGyro>::GetInstance();
      pose = estimate(time,steering_angle,iVar1,pCVar4->m_fAngVel);
      Write(this,p_Var5->time,pose);
    }
    CloseResultFiles(this);
    iVar1 = 0;
    DrawGnuplot(this,false,0.0,0.0,0.0,0.0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press any key in this window to quit.");
    std::endl<char,std::char_traits<char>>(poVar2);
    getch();
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error occurred in ReadInputFile().");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int CTestTricycle::Run(const int nTestCase)
{
	/// robot pose (x, y, heading)
	SPose pose;

	/// set filenames for input, pose, and contour
	SetFilename(nTestCase);

	/// read the input file
	if (ReadInputFile() != 0)
	{
		std::cout << "Error occurred in ReadInputFile()." << std::endl;
		return -1;
	}

	/// create result files (pose, contour)
	CreateResultFiles();

	/// write initial pose to output files
	//@{
	CTricycle::GetInstance()->GetRobotPose(pose);
	Write(0.f, pose);
	//@}

	/// calculate odometry for each record
	//@{
	for (std::vector<SRecord>::iterator it = m_vRecord.begin(); \
		it != m_vRecord.end(); ++it)
	{
		/*
		std::cout << "time: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->time << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "steering_angle: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->steering_angle << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "encoder_ticks: ";
		std::cout << std::setfill('0') << std::setw(3);
		std::cout << it->encoder_ticks << ", ";

		std::cout << "angular_velocity: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->angular_velocity << std::endl;
		std::cout.unsetf(std::ios::fixed);
		*/

		/// update virtual gyro
		CVirtualGyro::GetInstance()->Update(it->time, it->steering_angle, it->encoder_ticks);

		/// calculate robot pose
		pose = estimate( \
			it->time, \
			it->steering_angle, \
			it->encoder_ticks, \
			CVirtualGyro::GetInstance()->GetAngVel());

		/// write a robot pose to the output files (pose, contour)
		Write(it->time, pose);
	}
	//@}

	/// close result files (pose, contour)
	CloseResultFiles();

	/// draw a result plot
	DrawGnuplot();

	/// wait for user's key press
	//@{
	std::cout << "Press any key in this window to quit." << std::endl;
	getch();
	//@}

#if defined(WIN32)
	if (m_pGnuPlot)
		delete m_pGnuPlot;	///< delete CpGnuplot instance
#else // defined(WIN32)
#endif // defined(WIN32)

	return 0;
}